

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_string_radix_sort.h
# Opt level: O2

void __thiscall
parallel_string_radix_sort::ParallelStringRadixSort<const_unsigned_char_*>::Sort16
          (ParallelStringRadixSort<const_unsigned_char_*> *this,size_t bgn,size_t end,size_t depth,
          bool flip)

{
  long *plVar1;
  uchar uVar2;
  uint16_t *puVar3;
  long lVar4;
  uchar *puVar5;
  uchar **ppuVar6;
  void *__s;
  ulong uVar7;
  ulong uVar8;
  uchar **ppuVar9;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  uint16_t uVar14;
  undefined7 in_register_00000081;
  size_t i_1;
  long lVar15;
  
  __s = operator_new__(0x80000);
  memset(__s,0,0x80000);
  ppuVar9 = this->temp_;
  ppuVar6 = this->data_;
  if ((int)CONCAT71(in_register_00000081,flip) != 0) {
    ppuVar9 = this->data_;
    ppuVar6 = this->temp_;
  }
  puVar3 = this->letters16_;
  for (sVar10 = bgn; sVar11 = bgn, end != sVar10; sVar10 = sVar10 + 1) {
    uVar2 = ppuVar6[sVar10][depth];
    if (uVar2 == '\0') {
      uVar14 = 0;
    }
    else {
      uVar14 = CONCAT11(uVar2,ppuVar6[sVar10][depth + 1]);
    }
    puVar3[sVar10] = uVar14;
  }
  for (; end != sVar11; sVar11 = sVar11 + 1) {
    plVar1 = (long *)((long)__s + (ulong)puVar3[sVar11] * 8);
    *plVar1 = *plVar1 + 1;
  }
  lVar15 = 0;
  for (lVar12 = 0; sVar10 = bgn, lVar12 != 0x10000; lVar12 = lVar12 + 1) {
    lVar4 = *(long *)((long)__s + lVar12 * 8);
    *(long *)((long)__s + lVar12 * 8) = lVar15;
    lVar15 = lVar4 + lVar15;
  }
  for (; end != sVar10; sVar10 = sVar10 + 1) {
    lVar15 = *(long *)((long)__s + (ulong)puVar3[sVar10] * 8);
    *(long *)((long)__s + (ulong)puVar3[sVar10] * 8) = lVar15 + 1;
    puVar5 = ppuVar9[bgn + lVar15];
    ppuVar9[bgn + lVar15] = ppuVar6[sVar10];
    ppuVar6[sVar10] = puVar5;
  }
  if (!flip) {
    uVar7 = 0;
    do {
      uVar8 = uVar7;
      uVar13 = uVar7;
      if (uVar7 != 0) {
        if (uVar7 == 0x100) break;
        uVar13 = uVar7 << 8;
        uVar8 = *(ulong *)((long)__s + uVar7 * 0x800 + -8);
      }
      uVar13 = *(ulong *)((long)__s + uVar13 * 8);
      for (; uVar8 < uVar13; uVar8 = uVar8 + 1) {
        puVar5 = ppuVar6[bgn + uVar8];
        ppuVar6[bgn + uVar8] = ppuVar9[bgn + uVar8];
        ppuVar9[bgn + uVar8] = puVar5;
      }
      uVar7 = uVar7 + 1;
    } while( true );
  }
  for (lVar15 = 1; lVar15 != 0x10000; lVar15 = lVar15 + 1) {
    if ((char)lVar15 != '\0') {
      lVar12 = *(long *)((long)__s + lVar15 * 8 + -8);
      lVar4 = *(long *)((long)__s + lVar15 * 8);
      if (lVar4 != lVar12) {
        Recurse(this,lVar12 + bgn,lVar4 + bgn,depth + 2,!flip);
      }
    }
  }
  operator_delete__(__s);
  return;
}

Assistant:

void ParallelStringRadixSort<StringType>
::Sort16(size_t bgn, size_t end, size_t depth, bool flip) {
  size_t *cnt = new size_t[1 << 16]();
  PSRS_CHECK(cnt != NULL);

  StringType *src = (flip ? temp_ : data_) + bgn;
  StringType *dst = (flip ? data_ : temp_) + bgn;
  uint16_t *let = letters16_ + bgn;
  size_t n = end - bgn;

  for (size_t i = 0; i < n; ++i) {
    uint16_t x = src[i][depth];
    let[i] = x == 0 ? 0 : ((x << 8) | src[i][depth + 1]);
  }

  for (size_t i = 0; i < n; ++i) {
    ++cnt[let[i]];
  }

  size_t s = 0;
  for (int i = 0; i < 1 << 16; ++i) {
    std::swap(cnt[i], s);
    s += cnt[i];
  }

  for (size_t i = 0; i < n; ++i) {
    std::swap(dst[cnt[let[i]]++], src[i]);
  }

  if (flip == false) {
    for (int i = 0; i < 1 << 8; ++i) {
      size_t b = i == 0 ? 0 : cnt[(i << 8) - 1];
      size_t e = cnt[i << 8];
      for (size_t j = b; j < e; ++j) {
        std::swap(src[j], dst[j]);
      }
    }
  }

  for (size_t i = 1; i < 1 << 16; ++i) {
    if ((i & 0xFF) != 0 && cnt[i] - cnt[i - 1] >= 1) {
      Recurse(bgn + cnt[i - 1], bgn + cnt[i], depth + 2, !flip);
    }
  }

  delete [] cnt;
}